

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::read_piece_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,read_piece_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  char msg [200];
  string local_128;
  undefined8 local_108 [4];
  char local_e8 [200];
  
  if ((this->error).failed_ == true) {
    torrent_alert::message_abi_cxx11_(&local_128,&this->super_torrent_alert);
    uVar1 = (this->piece).m_val;
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(local_108,peVar2,(ulong)(uint)(this->error).val_);
    snprintf(local_e8,200,"%s: read_piece %d failed: %s",local_128._M_dataplus._M_p,(ulong)uVar1,
             local_108[0]);
    ::std::__cxx11::string::~string((string *)local_108);
  }
  else {
    torrent_alert::message_abi_cxx11_(&local_128,&this->super_torrent_alert);
    snprintf(local_e8,200,"%s: read_piece %d successful",local_128._M_dataplus._M_p,
             (ulong)(uint)(this->piece).m_val);
  }
  ::std::__cxx11::string::~string((string *)&local_128);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string read_piece_alert::message() const
	{
#ifdef TORRENT_DISABLE_ALERT_MSG
		return {};
#else
		char msg[200];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d failed: %s"
				, torrent_alert::message().c_str() , static_cast<int>(piece)
				, error.message().c_str());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), "%s: read_piece %d successful"
				, torrent_alert::message().c_str() , static_cast<int>(piece));
		}
		return msg;
#endif
	}